

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  anon_class_1_0_00000001 *func;
  Values t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar4;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *m;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *this_00;
  initializer_list<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>
  __l;
  allocator<char> local_6de;
  allocator<char> local_6dd;
  allocator<char> local_6dc;
  allocator<char> local_6db;
  allocator<char> local_6da;
  allocator<char> local_6d9;
  allocator<char> local_6d8;
  allocator<char> local_6d7;
  allocator<char> local_6d6;
  allocator<char> local_6d5;
  allocator<char> local_6d4;
  allocator<char> local_6d3;
  allocator<char> local_6d2;
  allocator<char> local_6d1;
  cmake *local_6d0;
  char *local_6c8;
  anon_class_1_0_00000001 *local_6c0;
  char local_6b8 [8];
  undefined8 uStack_6b0;
  char *local_6a8;
  size_t local_6a0;
  char local_698 [8];
  undefined8 uStack_690;
  char *local_688;
  size_t local_680;
  char local_678 [8];
  undefined8 uStack_670;
  char *local_668;
  size_t local_660;
  char local_658 [8];
  undefined8 uStack_650;
  char *local_648;
  size_t local_640;
  char local_638 [8];
  undefined8 uStack_630;
  char *local_628;
  size_t local_620;
  char local_618 [8];
  undefined8 uStack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_608;
  size_t local_600;
  char local_5f8 [8];
  undefined8 uStack_5f0;
  undefined1 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598 [8];
  undefined8 uStack_590;
  undefined1 *local_588;
  undefined8 local_580;
  undefined1 local_578 [8];
  undefined8 uStack_570;
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  size_type local_520;
  char local_518 [8];
  undefined8 uStack_510;
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  arguments;
  cmAlphaNum local_4f0;
  cmAlphaNum local_4c0;
  string local_490;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  local_470;
  string local_3e8;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  char *local_3a8;
  size_t local_3a0;
  char local_398 [8];
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  code *local_370;
  code *local_368;
  string local_360;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [8];
  undefined8 uStack_328;
  char *local_320;
  size_t local_318;
  char local_310 [8];
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *local_2e0;
  string local_2d8;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  char *local_298;
  size_t local_290;
  char local_288 [8];
  undefined8 uStack_280;
  undefined8 local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  undefined8 local_268;
  code *local_260;
  code *local_258;
  string local_250;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  char *local_210;
  size_t local_208;
  char local_200 [8];
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  string local_1c8;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  char *local_188;
  size_t local_180;
  char local_178 [8];
  undefined8 uStack_170;
  undefined4 local_168;
  undefined8 local_164;
  undefined8 uStack_15c;
  undefined4 local_154;
  code *local_150;
  code *local_148;
  string local_140;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined8 uStack_108;
  char *local_100;
  anon_class_1_0_00000001 *local_f8;
  char local_f0 [8];
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 local_dc;
  undefined8 uStack_d4;
  undefined4 local_cc;
  code *local_c8;
  code *local_c0;
  cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> local_b8 [136];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"-D",&local_6d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"-D must be followed with VAR=VALUE.",&local_6d2);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_600;
  local_4c0.View_._M_str = (char *)local_608;
  cmStrCat<>(&local_470.InvalidSyntaxMessage,&local_4f0,&local_4c0);
  local_470.InvalidValueMessage._M_dataplus._M_p = (pointer)&local_470.InvalidValueMessage.field_2;
  if (local_528 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518) {
    local_470.InvalidValueMessage.field_2._8_8_ = uStack_510;
  }
  else {
    local_470.InvalidValueMessage._M_dataplus._M_p = (pointer)local_528;
  }
  local_470.Name._M_dataplus._M_p = (pointer)&local_470.Name.field_2;
  local_470.InvalidValueMessage._M_string_length = local_520;
  local_520 = 0;
  local_518[0] = '\0';
  if (local_608 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8) {
    local_470.Name.field_2._8_8_ = uStack_5f0;
  }
  else {
    local_470.Name._M_dataplus._M_p = (pointer)local_608;
  }
  local_470.Name._M_string_length = local_600;
  local_600 = 0;
  local_5f8[0] = '\0';
  local_470.Type = One;
  local_470.SeparatorNeeded = No;
  local_470.StoreCall.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_470.StoreCall.super__Function_base._M_functor._8_8_ = 0;
  local_470.StoreCall._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:417:23)>
       ::_M_invoke;
  local_470.StoreCall.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:417:23)>
       ::_M_manager;
  local_6d0 = this;
  local_608 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8;
  local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"-W",&local_6d3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"-W must be followed with [no-]<name>.",&local_6d4);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_620;
  local_4c0.View_._M_str = local_628;
  cmStrCat<>(&local_3e8,&local_4f0,&local_4c0);
  local_3c8 = local_3b8;
  if (local_548 == local_538) {
    uStack_3b0 = uStack_530;
  }
  else {
    local_3c8 = local_548;
  }
  local_3a8 = local_398;
  local_3c0 = local_540;
  local_540 = 0;
  local_538[0] = 0;
  if (local_628 == local_618) {
    uStack_390 = uStack_610;
  }
  else {
    local_3a8 = local_628;
  }
  local_3a0 = local_620;
  local_620 = 0;
  local_618[0] = '\0';
  local_388 = 0x100000001;
  local_380 = 0;
  uStack_378 = 0;
  local_368 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:434:24)>
              ::_M_invoke;
  local_370 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:434:24)>
              ::_M_manager;
  local_628 = local_618;
  local_548 = local_538;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"-U",&local_6d5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"-U must be followed with VAR.",&local_6d6);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_640;
  local_4c0.View_._M_str = local_648;
  cmStrCat<>(&local_360,&local_4f0,&local_4c0);
  local_340 = local_330;
  if (local_568 == local_558) {
    uStack_328 = uStack_550;
  }
  else {
    local_340 = local_568;
  }
  local_320 = local_310;
  local_338 = local_560;
  local_560 = 0;
  local_558[0] = 0;
  if (local_648 == local_638) {
    uStack_308 = uStack_630;
  }
  else {
    local_320 = local_648;
  }
  local_318 = local_640;
  local_640 = 0;
  local_638[0] = '\0';
  local_300 = 0x100000001;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e0 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:475:22)>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:475:22)>
              ::_M_manager;
  local_648 = local_638;
  local_568 = local_558;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"-C",&local_6d7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"-C must be followed by a file name.",&local_6d8);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_660;
  local_4c0.View_._M_str = local_668;
  cmStrCat<>(&local_2d8,&local_4f0,&local_4c0);
  local_290 = local_660;
  local_2b8 = local_2a8;
  if (local_588 == local_578) {
    uStack_2a0 = uStack_570;
  }
  else {
    local_2b8 = local_588;
  }
  local_298 = local_288;
  local_2b0 = local_580;
  local_580 = 0;
  local_578[0] = 0;
  if (local_668 == local_658) {
    uStack_280 = uStack_650;
  }
  else {
    local_298 = local_668;
  }
  local_660 = 0;
  local_658[0] = '\0';
  local_278 = 0x100000001;
  local_268 = 0;
  local_258 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:552:7)>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:552:7)>
              ::_M_manager;
  local_668 = local_658;
  local_588 = local_578;
  local_270 = args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"-P",&local_6d9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"-P must be followed by a file name.",&local_6da);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_680;
  local_4c0.View_._M_str = local_688;
  cmStrCat<>(&local_250,&local_4f0,&local_4c0);
  local_208 = local_680;
  local_230 = local_220;
  if (local_5a8 == local_598) {
    uStack_218 = uStack_590;
  }
  else {
    local_230 = local_5a8;
  }
  local_210 = local_200;
  local_228 = local_5a0;
  local_5a0 = 0;
  local_598[0] = 0;
  if (local_688 == local_678) {
    uStack_1f8 = uStack_670;
  }
  else {
    local_210 = local_688;
  }
  local_680 = 0;
  local_678[0] = '\0';
  local_1f0 = 0x100000001;
  local_1e0 = 0;
  local_1d0 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:502:23)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:502:23)>
              ::_M_manager;
  local_688 = local_678;
  local_5a8 = local_598;
  local_1e8 = args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"--toolchain",&local_6db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"No file specified for --toolchain",&local_6dc);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = local_6a0;
  local_4c0.View_._M_str = local_6a8;
  cmStrCat<>(&local_1c8,&local_4f0,&local_4c0);
  local_180 = local_6a0;
  local_1a8 = local_198;
  if (local_5c8 == local_5b8) {
    uStack_190 = uStack_5b0;
  }
  else {
    local_1a8 = local_5c8;
  }
  local_188 = local_178;
  local_1a0 = local_5c0;
  local_5c0 = 0;
  local_5b8[0] = 0;
  if (local_6a8 == local_698) {
    uStack_170 = uStack_690;
  }
  else {
    local_188 = local_6a8;
  }
  local_6a0 = 0;
  local_698[0] = '\0';
  local_168 = 1;
  local_164 = 0;
  uStack_15c = 0;
  local_154 = 0;
  local_148 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:529:26)>
              ::_M_invoke;
  local_150 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:529:26)>
              ::_M_manager;
  local_6a8 = local_698;
  local_5c8 = local_5b8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"--install-prefix",&local_6dd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"No install directory specified for --install-prefix",&local_6de);
  local_4f0.View_._M_len = 0x17;
  local_4f0.View_._M_str = " is invalid syntax for ";
  local_4c0.View_._M_len = (size_t)local_6c0;
  local_4c0.View_._M_str = local_6c8;
  cmStrCat<>(&local_140,&local_4f0,&local_4c0);
  func = local_6c0;
  local_120 = local_110;
  if (local_5e8 == local_5d8) {
    uStack_108 = uStack_5d0;
  }
  else {
    local_120 = local_5e8;
  }
  local_100 = local_f0;
  local_118 = local_5e0;
  local_5e0 = 0;
  local_5d8[0] = 0;
  if (local_6c8 == local_6b8) {
    uStack_e8 = uStack_6b0;
  }
  else {
    local_100 = local_6c8;
  }
  local_6c0 = (anon_class_1_0_00000001 *)0x0;
  local_f8 = func;
  local_6b8[0] = '\0';
  local_e0 = 1;
  local_dc = 0;
  uStack_d4 = 0;
  local_cc = 0;
  local_c0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:514:23)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:514:23)>
             ::_M_manager;
  local_6c8 = local_6b8;
  local_5e8 = local_5d8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"--find-package",(allocator<char> *)&local_4f0);
  cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
  cmCommandLineArgument<(anonymous_namespace)::__8&>(local_b8,&local_490,t,func);
  __l._M_len = 8;
  __l._M_array = &local_470;
  std::
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  ::vector(&arguments,__l,(allocator_type *)&local_4c0);
  lVar4 = 0x3b8;
  do {
    cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
    ::~cmCommandLineArgument
              ((cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                *)((long)&local_470.InvalidSyntaxMessage._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != -0x88);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_608);
  local_470.InvalidSyntaxMessage._M_dataplus._M_p = (pointer)0x1;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
        local_470.InvalidSyntaxMessage._M_dataplus._M_p) {
      bVar3 = true;
      if (local_6d0->CurrentWorkingMode == FIND_PACKAGE_MODE) {
        bVar3 = FindPackage(local_6d0,args);
      }
LAB_00242431:
      std::
      vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
      ::~vector(&arguments);
      return bVar3;
    }
    __lhs = pbVar1 + (long)local_470.InvalidSyntaxMessage._M_dataplus._M_p;
    bVar3 = std::operator==(__lhs,"--");
    pcVar2 = arguments.
             super__Vector_base<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = arguments.
              super__Vector_base<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((bVar3) && (local_6d0->CurrentWorkingMode == SCRIPT_MODE)) {
      bVar3 = true;
      goto LAB_00242431;
    }
    for (; this_00 != pcVar2; this_00 = this_00 + 1) {
      bVar3 = cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::matches(this_00,__lhs);
      if (bVar3) {
        local_4f0.View_._M_len = (size_t)local_6d0;
        bVar3 = cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
                parse<unsigned_long,cmake*>
                          ((cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *)
                           this_00,__lhs,(unsigned_long *)&local_470,args,(cmake **)&local_4f0);
        if (!bVar3) {
          bVar3 = false;
          goto LAB_00242431;
        }
      }
    }
    local_470.InvalidSyntaxMessage._M_dataplus._M_p =
         local_470.InvalidSyntaxMessage._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  auto DefineLambda = [](std::string const& entry, cmake* state) -> bool {
    std::string var;
    std::string value;
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (cmState::ParseCacheEntry(entry, var, value, type)) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(var);
#endif
      state->ProcessCacheArg(var, value, type);
    } else {
      cmSystemTools::Error(cmStrCat("Parse error in command line argument: ",
                                    entry, "\n Should be: VAR:type=value\n"));
      return false;
    }
    return true;
  };

  auto WarningLambda = [](cm::string_view entry, cmake* state) -> bool {
    bool foundNo = false;
    bool foundError = false;

    if (cmHasLiteralPrefix(entry, "no-")) {
      foundNo = true;
      entry.remove_prefix(3);
    }

    if (cmHasLiteralPrefix(entry, "error=")) {
      foundError = true;
      entry.remove_prefix(6);
    }

    if (entry.empty()) {
      cmSystemTools::Error("No warning name provided.");
      return false;
    }

    std::string const name = std::string(entry);
    if (!foundNo && !foundError) {
      // -W<name>
      state->DiagLevels[name] = std::max(state->DiagLevels[name], DIAG_WARN);
    } else if (foundNo && !foundError) {
      // -Wno<name>
      state->DiagLevels[name] = DIAG_IGNORE;
    } else if (!foundNo && foundError) {
      // -Werror=<name>
      state->DiagLevels[name] = DIAG_ERROR;
    } else {
      // -Wno-error=<name>
      // This can downgrade an error to a warning, but should not enable
      // or disable a warning in the first place.
      auto dli = state->DiagLevels.find(name);
      if (dli != state->DiagLevels.end()) {
        dli->second = std::min(dli->second, DIAG_WARN);
      }
    }
    return true;
  };

  auto UnSetLambda = [](std::string const& entryPattern,
                        cmake* state) -> bool {
    cmsys::RegularExpression regex(
      cmsys::Glob::PatternToRegex(entryPattern, true, true));
    // go through all cache entries and collect the vars which will be
    // removed
    std::vector<std::string> entriesToDelete;
    std::vector<std::string> cacheKeys = state->State->GetCacheEntryKeys();
    for (std::string const& ck : cacheKeys) {
      cmStateEnums::CacheEntryType t = state->State->GetCacheEntryType(ck);
      if (t != cmStateEnums::STATIC) {
        if (regex.find(ck)) {
          entriesToDelete.push_back(ck);
        }
      }
    }

    // now remove them from the cache
    for (std::string const& currentEntry : entriesToDelete) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(currentEntry);
#endif
      state->State->RemoveCacheEntry(currentEntry);
    }
    return true;
  };

  auto ScriptLambda = [&](std::string const& path, cmake* state) -> bool {
    // Register fake project commands that hint misuse in script mode.
    GetProjectCommandsInScriptMode(state->GetState());
    // Documented behavior of CMAKE{,_CURRENT}_{SOURCE,BINARY}_DIR is to be
    // set to $PWD for -P mode.
    state->SetWorkingMode(SCRIPT_MODE);
    state->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    state->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    state->ReadListFile(args, path);
    return true;
  };

  auto PrefixLambda = [&](std::string const& path, cmake* state) -> bool {
    const std::string var = "CMAKE_INSTALL_PREFIX";
    cmStateEnums::CacheEntryType type = cmStateEnums::PATH;
    cmCMakePath absolutePath(path);
    if (absolutePath.IsAbsolute()) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(var);
#endif
      state->ProcessCacheArg(var, path, type);
      return true;
    }
    cmSystemTools::Error("Absolute paths are required for --install-prefix");
    return false;
  };

  auto ToolchainLambda = [&](std::string const& path, cmake* state) -> bool {
    const std::string var = "CMAKE_TOOLCHAIN_FILE";
    cmStateEnums::CacheEntryType type = cmStateEnums::FILEPATH;
#ifndef CMAKE_BOOTSTRAP
    state->UnprocessedPresetVariables.erase(var);
#endif
    state->ProcessCacheArg(var, path, type);
    return true;
  };

  std::vector<CommandArgument> arguments = {
    CommandArgument{ "-D", "-D must be followed with VAR=VALUE.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, DefineLambda },
    CommandArgument{ "-W", "-W must be followed with [no-]<name>.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, WarningLambda },
    CommandArgument{ "-U", "-U must be followed with VAR.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, UnSetLambda },
    CommandArgument{
      "-C", "-C must be followed by a file name.",
      CommandArgument::Values::One, CommandArgument::RequiresSeparator::No,
      [&](std::string const& value, cmake* state) -> bool {
        if (value.empty()) {
          cmSystemTools::Error("No file name specified for -C");
          return false;
        }
        cmSystemTools::Stdout("loading initial cache file " + value + "\n");
        // Resolve script path specified on command line
        // relative to $PWD.
        auto path = cmSystemTools::CollapseFullPath(value);
        state->ReadListFile(args, path);
        return true;
      } },

    CommandArgument{ "-P", "-P must be followed by a file name.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, ScriptLambda },
    CommandArgument{ "--toolchain", "No file specified for --toolchain",
                     CommandArgument::Values::One, ToolchainLambda },
    CommandArgument{ "--install-prefix",
                     "No install directory specified for --install-prefix",
                     CommandArgument::Values::One, PrefixLambda },
    CommandArgument{ "--find-package", CommandArgument::Values::Zero,
                     IgnoreAndTrueLambda },
  };
  for (decltype(args.size()) i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];

    if (arg == "--" && this->GetWorkingMode() == SCRIPT_MODE) {
      // Stop processing CMake args and avoid possible errors
      // when arbitrary args are given to CMake script.
      break;
    }
    for (auto const& m : arguments) {
      if (m.matches(arg)) {
        const bool parsedCorrectly = m.parse(arg, i, args, this);
        if (!parsedCorrectly) {
          return false;
        }
      }
    }
  }

  if (this->GetWorkingMode() == FIND_PACKAGE_MODE) {
    return this->FindPackage(args);
  }

  return true;
}